

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O0

void absl::str_format_internal::anon_unknown_0::FormatFFast<unsigned_long>
               (unsigned_long v,int exp,FormatState *state)

{
  size_t sVar1;
  uint exp_00;
  string_view data_postfix;
  bool bVar2;
  int amount;
  long lVar3;
  size_t in_R9;
  uint128 lhs;
  uint128 v_00;
  char *local_178;
  uint64_t local_170;
  char *local_168;
  basic_string_view<char,_std::char_traits<char>_> local_160;
  string_view local_150;
  size_type local_140;
  size_t size;
  uint64_t local_130;
  uint128 local_128;
  uint128 local_118;
  int local_fc;
  char *pcStack_f8;
  int total_bits;
  char *fractional_digits_end;
  char *fractional_digits_start;
  char *integral_digits_start;
  char *integral_digits_end;
  char buffer [171];
  int input_bits;
  FormatState *state_local;
  int exp_local;
  unsigned_long v_local;
  
  buffer[0x22] = '.';
  integral_digits_start = buffer + 0x22;
  pcStack_f8 = buffer + 0x23;
  fractional_digits_end = pcStack_f8;
  if (exp < 0) {
    exp_00 = -exp;
    if ((int)exp_00 < 0x40) {
      local_170 = v >> ((byte)exp_00 & 0x3f);
    }
    else {
      local_170 = 0;
    }
    fractional_digits_start = PrintIntegralDigitsFromRightFast(local_170,integral_digits_start);
    fractional_digits_start[-1] = '0';
    if ((int)exp_00 < 0x41) {
      local_178 = PrintFractionalDigitsFast(v,fractional_digits_end,exp_00,state->precision);
    }
    else {
      uint128::uint128((uint128 *)&size,v);
      v_00.hi_ = (uint64_t)fractional_digits_end;
      v_00.lo_ = local_130;
      local_178 = PrintFractionalDigitsFast
                            ((anon_unknown_0 *)size,v_00,(char *)(ulong)exp_00,(int)state->precision
                             ,in_R9);
    }
    pcStack_f8 = local_178;
    if (fractional_digits_start[-1] != '0') {
      fractional_digits_start = fractional_digits_start + -1;
    }
  }
  else {
    amount = LeadingZeros(v);
    local_fc = (0x40 - amount) + exp;
    if (local_fc < 0x41) {
      local_168 = PrintIntegralDigitsFromRightFast(v << ((byte)exp & 0x3f),integral_digits_start);
    }
    else {
      uint128::uint128(&local_128,v);
      lhs.hi_._0_4_ = exp;
      lhs.lo_ = local_128.hi_;
      lhs.hi_._4_4_ = 0;
      local_118 = absl::operator<<((absl *)local_128.lo_,lhs,amount);
      local_168 = PrintIntegralDigitsFromRightFast(local_118,integral_digits_start);
    }
    fractional_digits_start = local_168;
  }
  local_140 = (long)pcStack_f8 - (long)fractional_digits_start;
  bVar2 = FormatState::ShouldPrintDot(state);
  if (!bVar2) {
    local_140 = local_140 - 1;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_150,fractional_digits_start,local_140);
  sVar1 = state->precision;
  lVar3 = (long)pcStack_f8 - (long)fractional_digits_end;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_160,"");
  data_postfix._M_str = local_160._M_str;
  data_postfix._M_len = local_160._M_len;
  FinalPrint(state,local_150,0,sVar1 - lVar3,data_postfix);
  return;
}

Assistant:

void FormatFFast(Int v, int exp, const FormatState &state) {
  constexpr int input_bits = sizeof(Int) * 8;

  static constexpr size_t integral_size =
      /* in case we need to round up an extra digit */ 1 +
      /* decimal digits for uint128 */ 40 + 1;
  char buffer[integral_size + /* . */ 1 + /* max digits uint128 */ 128];
  buffer[integral_size] = '.';
  char *const integral_digits_end = buffer + integral_size;
  char *integral_digits_start;
  char *const fractional_digits_start = buffer + integral_size + 1;
  char *fractional_digits_end = fractional_digits_start;

  if (exp >= 0) {
    const int total_bits = input_bits - LeadingZeros(v) + exp;
    integral_digits_start =
        total_bits <= 64
            ? PrintIntegralDigitsFromRightFast(static_cast<uint64_t>(v) << exp,
                                               integral_digits_end)
            : PrintIntegralDigitsFromRightFast(static_cast<uint128>(v) << exp,
                                               integral_digits_end);
  } else {
    exp = -exp;

    integral_digits_start = PrintIntegralDigitsFromRightFast(
        exp < input_bits ? v >> exp : 0, integral_digits_end);
    // PrintFractionalDigits may pull a carried 1 all the way up through the
    // integral portion.
    integral_digits_start[-1] = '0';

    fractional_digits_end =
        exp <= 64 ? PrintFractionalDigitsFast(v, fractional_digits_start, exp,
                                              state.precision)
                  : PrintFractionalDigitsFast(static_cast<uint128>(v),
                                              fractional_digits_start, exp,
                                              state.precision);
    // There was a carry, so include the first digit too.
    if (integral_digits_start[-1] != '0') --integral_digits_start;
  }

  size_t size =
      static_cast<size_t>(fractional_digits_end - integral_digits_start);

  // In `alt` mode (flag #) we keep the `.` even if there are no fractional
  // digits. In non-alt mode, we strip it.
  if (!state.ShouldPrintDot()) --size;
  FinalPrint(state, absl::string_view(integral_digits_start, size),
             /*padding_offset=*/0,
             state.precision - static_cast<size_t>(fractional_digits_end -
                                                   fractional_digits_start),
             /*data_postfix=*/"");
}